

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O1

void __thiscall
Assimp::HMPImporter::CreateMaterial(HMPImporter *this,uchar *szCurrent,uchar **szCurrentOut)

{
  int iVar1;
  uchar *puVar2;
  aiMesh *paVar3;
  undefined1 auVar4 [16];
  aiVector3D *__s;
  aiMaterial *this_00;
  aiMaterial **ppaVar5;
  ulong uVar6;
  int iMode;
  aiColor3D clr;
  aiString szName;
  undefined4 local_454;
  uchar *local_450;
  uchar **local_448;
  undefined8 local_440;
  undefined4 local_438;
  aiString local_434;
  
  puVar2 = (this->super_MDLImporter).mBuffer;
  local_448 = szCurrentOut;
  local_450 = szCurrent;
  if (*(int *)(puVar2 + 0x30) == 0) {
    local_454 = 2;
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    aiMaterial::AddBinaryProperty(this_00,&local_454,4,"$mat.shadingm",0,0,aiPTI_Integer);
    local_440 = 0x3f19999a3f19999a;
    local_438 = 0x3f19999a;
    aiMaterial::AddBinaryProperty(this_00,&local_440,0xc,"$clr.diffuse",0,0,aiPTI_Float);
    aiMaterial::AddBinaryProperty(this_00,&local_440,0xc,"$clr.specular",0,0,aiPTI_Float);
    local_440 = 0x3d4ccccd3d4ccccd;
    local_438 = 0x3d4ccccd;
    aiMaterial::AddBinaryProperty(this_00,&local_440,0xc,"$clr.ambient",0,0,aiPTI_Float);
    local_434.length = 0;
    local_434.data[0] = '\0';
    memset(local_434.data + 1,0x1b,0x3ff);
    local_434.length = 0xf;
    builtin_strncpy(local_434.data,"DefaultMaterial",0x10);
    aiMaterial::AddProperty(this_00,&local_434,"?mat.name",0,0);
    ((this->super_MDLImporter).pScene)->mNumMaterials = 1;
    ppaVar5 = (aiMaterial **)operator_new__(8);
    ((this->super_MDLImporter).pScene)->mMaterials = ppaVar5;
    *((this->super_MDLImporter).pScene)->mMaterials = this_00;
  }
  else {
    paVar3 = *((this->super_MDLImporter).pScene)->mMeshes;
    iVar1 = *(int *)(puVar2 + 0x3c);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)iVar1;
    uVar6 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0xc),8) == 0) {
      uVar6 = SUB168(auVar4 * ZEXT816(0xc),0);
    }
    __s = (aiVector3D *)operator_new__(uVar6);
    if (iVar1 != 0) {
      memset(__s,0,(((long)iVar1 * 0xc - 0xcU) / 0xc) * 0xc + 0xc);
    }
    paVar3->mTextureCoords[0] = __s;
    paVar3->mNumUVComponents[0] = 2;
    ReadFirstSkin(this,*(uint *)(puVar2 + 0x30),szCurrent,&local_450);
  }
  *local_448 = local_450;
  return;
}

Assistant:

void HMPImporter::CreateMaterial(const unsigned char* szCurrent,
    const unsigned char** szCurrentOut)
{
    aiMesh* const pcMesh = pScene->mMeshes[0];
    const HMP::Header_HMP5* const pcHeader = (const HMP::Header_HMP5*)mBuffer;

    // we don't need to generate texture coordinates if
    // we have no textures in the file ...
    if (pcHeader->numskins)
    {
        pcMesh->mTextureCoords[0] = new aiVector3D[pcHeader->numverts];
        pcMesh->mNumUVComponents[0] = 2;

        // now read the first skin and skip all others
        ReadFirstSkin(pcHeader->numskins,szCurrent,&szCurrent);
    }
    else
    {
        // generate a default material
        const int iMode = (int)aiShadingMode_Gouraud;
        aiMaterial* pcHelper = new aiMaterial();
        pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.6f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        aiString szName;
        szName.Set(AI_DEFAULT_MATERIAL_NAME);
        pcHelper->AddProperty(&szName,AI_MATKEY_NAME);

        // add the material to the scene
        pScene->mNumMaterials = 1;
        pScene->mMaterials = new aiMaterial*[1];
        pScene->mMaterials[0] = pcHelper;
    }
    *szCurrentOut = szCurrent;
}